

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tctok.cpp
# Opt level: O1

int __thiscall CTcTokenizer::peek_ahead(CTcTokenizer *this,char *s1,char *s2)

{
  CTcToken *tok;
  char *pcVar1;
  ulong uVar2;
  undefined4 uVar3;
  int iVar4;
  tc_toktyp_t tVar5;
  size_t sVar6;
  uint uVar7;
  
  uVar7 = 0;
  if ((this->curtok_).typ_ == TOKT_SYM) {
    sVar6 = strlen(s1);
    if ((this->curtok_).text_len_ == sVar6) {
      iVar4 = bcmp((this->curtok_).text_,s1,sVar6);
      if (iVar4 == 0) {
        tok = &this->curtok_;
        tVar5 = next(this);
        uVar7 = 0;
        if (tVar5 == TOKT_SYM) {
          sVar6 = strlen(s2);
          if ((this->curtok_).text_len_ == sVar6) {
            iVar4 = bcmp((this->curtok_).text_,s2,sVar6);
            uVar7 = (uint)(iVar4 == 0);
          }
        }
        push(this,tok);
        (this->curtok_).field_0x20 = (this->prvtok_).field_0x20;
        tVar5 = (this->prvtok_).typ_;
        uVar3 = *(undefined4 *)&(this->prvtok_).field_0x4;
        pcVar1 = (this->prvtok_).text_;
        uVar2 = (this->prvtok_).int_val_;
        (this->curtok_).text_len_ = (this->prvtok_).text_len_;
        (this->curtok_).int_val_ = uVar2;
        tok->typ_ = tVar5;
        *(undefined4 *)&tok->field_0x4 = uVar3;
        (this->curtok_).text_ = pcVar1;
        (this->prvtok_).typ_ = TOKT_INVALID;
      }
    }
  }
  return uVar7;
}

Assistant:

int CTcTokenizer::peek_ahead(const char *s1, const char *s2)
{
    /* if the first token doesn't match, the sequence doesn't match */
    if (cur() != TOKT_SYM || !cur_tok_matches(s1, strlen(s1)))
        return FALSE;

    /* check the next token - if it matches, we have a sequence match */
    int match = (next() == TOKT_SYM && cur_tok_matches(s2, strlen(s2)));

    /* whatever happened, un-get the second token, since we're just peeking */
    unget();

    /* return the match indication */
    return match;
}